

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                  *this,dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                        *ht,size_type min_buckets_wanted)

{
  int iVar1;
  bool bVar2;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *this_00;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *in_RSI;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *in_RDI;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *unaff_retaddr;
  size_type in_stack_00000020;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *in_stack_00000028;
  ValInfo *in_stack_ffffffffffffffb8;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
  *num_elts;
  
  num_elts = in_RDI;
  memcpy(in_RDI,in_RSI,0x30);
  iVar1 = (in_RSI->key_info).super_Hasher.num_hashes_;
  (in_RDI->key_info).super_Hasher.id_ = (in_RSI->key_info).super_Hasher.id_;
  (in_RDI->key_info).super_Hasher.num_hashes_ = iVar1;
  *(undefined8 *)&(in_RDI->key_info).super_Hasher.num_compares_ =
       *(undefined8 *)&(in_RSI->key_info).super_Hasher.num_compares_;
  (in_RDI->key_info).empty_key = (in_RSI->key_info).empty_key;
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  in_RDI->num_buckets = 0;
  ValInfo::ValInfo((ValInfo *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  in_RDI->table = (pointer)0x0;
  bVar2 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::use_empty
                    ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)in_RSI);
  if (bVar2) {
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
              (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    dense_hashtable<std::pair<int_const,DenseIntMap<int>>,int,Hasher,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SelectKey,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<int_const,DenseIntMap<int>>,int,Hasher,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SelectKey,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>>
              ((dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                *)min_buckets_wanted,in_stack_00000028,in_stack_00000020);
  }
  else {
    size(in_RSI);
    this_00 = (sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)
              sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::min_buckets
                        (unaff_retaddr,(size_type)num_elts,(size_type)in_RSI);
    in_RDI->num_buckets = (size_type)this_00;
    bucket_count(in_RDI);
    sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
              (this_00,(size_type)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }